

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_DetermineFramesPerBuffer
                  (PaAlsaStream *self,double sampleRate,PaStreamParameters *inputParameters,
                  PaStreamParameters *outputParameters,unsigned_long framesPerUserBuffer,
                  snd_pcm_hw_params_t *hwParamsCapture,snd_pcm_hw_params_t *hwParamsPlayback,
                  PaUtilHostBufferSizeMode *hostBufferSizeMode)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  pthread_t pVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  snd_pcm_uframes_t local_1e0;
  snd_pcm_uframes_t local_1c8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  double local_160;
  ulong local_158;
  ulong local_150;
  int __pa_unsure_error_id_11;
  int __pa_unsure_error_id_10;
  snd_pcm_hw_params_t *secondHwParams;
  snd_pcm_hw_params_t *firstHwParams;
  PaStreamParameters *firstStreamParams;
  PaAlsaStreamComponent *second;
  PaAlsaStreamComponent *first;
  int local_f0;
  uint maxPeriods;
  int __pa_unsure_error_id_9;
  int __pa_unsure_error_id_8;
  int __pa_unsure_error_id_7;
  int __pa_unsure_error_id_6;
  int __pa_unsure_error_id_5;
  int __pa_unsure_error_id_4;
  snd_pcm_uframes_t maxBufferSizePlayback;
  snd_pcm_uframes_t maxBufferSizeCapture;
  snd_pcm_uframes_t maxBufferSize;
  int __pa_unsure_error_id_3;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  snd_pcm_uframes_t maxPlayback;
  snd_pcm_uframes_t maxCapture;
  snd_pcm_uframes_t minPlayback;
  snd_pcm_uframes_t minCapture;
  snd_pcm_uframes_t periodSize;
  snd_pcm_uframes_t optimalPeriodSize;
  snd_pcm_uframes_t maxPeriodSize;
  snd_pcm_uframes_t minPeriodSize;
  snd_pcm_uframes_t e;
  snd_pcm_uframes_t desiredBufSz;
  int local_58;
  uint numPeriods;
  int accurate;
  int dir;
  unsigned_long framesPerHostBuffer;
  snd_pcm_hw_params_t *psStack_40;
  PaError result;
  snd_pcm_hw_params_t *hwParamsPlayback_local;
  snd_pcm_hw_params_t *hwParamsCapture_local;
  unsigned_long framesPerUserBuffer_local;
  PaStreamParameters *outputParameters_local;
  PaStreamParameters *inputParameters_local;
  double sampleRate_local;
  PaAlsaStream *self_local;
  
  framesPerHostBuffer._4_4_ = 0;
  _accurate = 0;
  numPeriods = 0;
  local_58 = 1;
  desiredBufSz._4_4_ = numPeriods_;
  psStack_40 = hwParamsPlayback;
  hwParamsPlayback_local = hwParamsCapture;
  hwParamsCapture_local = (snd_pcm_hw_params_t *)framesPerUserBuffer;
  framesPerUserBuffer_local = (unsigned_long)outputParameters;
  outputParameters_local = inputParameters;
  inputParameters_local = (PaStreamParameters *)sampleRate;
  sampleRate_local = (double)self;
  if (((self->capture).pcm == (snd_pcm_t *)0x0) || ((self->playback).pcm == (snd_pcm_t *)0x0)) {
    if ((self->capture).pcm == (snd_pcm_t *)0x0) {
      if ((self->playback).pcm == (snd_pcm_t *)0x0) {
        __assert_fail("self->playback.pcm",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xab6,
                      "PaError PaAlsaStream_DetermineFramesPerBuffer(PaAlsaStream *, double, const PaStreamParameters *, const PaStreamParameters *, unsigned long, snd_pcm_hw_params_t *, snd_pcm_hw_params_t *, PaUtilHostBufferSizeMode *)"
                     );
      }
      paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                             (&self->playback,outputParameters,framesPerUserBuffer,sampleRate,
                              hwParamsPlayback,&local_58);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( &self->playback, outputParameters, framesPerUserBuffer, sampleRate, hwParamsPlayback, &accurate )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2744\n"
                         );
        return paUtilErr_;
      }
      _accurate = *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x348);
    }
    else {
      paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                             (&self->capture,inputParameters,framesPerUserBuffer,sampleRate,
                              hwParamsCapture,&local_58);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( &self->capture, inputParameters, framesPerUserBuffer, sampleRate, hwParamsCapture, &accurate)\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2737\n"
                         );
        return paUtilErr_;
      }
      _accurate = *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x2c8);
    }
  }
  else if (framesPerUserBuffer == 0) {
    numPeriods = 0;
    __pa_unsure_error_id_2 =
         (*(code *)alsa_snd_pcm_hw_params_get_period_size_min)
                   (hwParamsCapture,&minPlayback,&numPeriods);
    if (__pa_unsure_error_id_2 < 0) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        lVar5 = (long)__pa_unsure_error_id_2;
        pcVar6 = (*alsa_snd_strerror)(__pa_unsure_error_id_2);
        PaUtil_SetLastHostErrorInfo(paALSA,lVar5,pcVar6);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_get_period_size_min( hwParamsCapture, &minCapture, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2598\n"
                       );
      return -9999;
    }
    numPeriods = 0;
    __pa_unsure_error_id_3 =
         (*(code *)alsa_snd_pcm_hw_params_get_period_size_min)(psStack_40,&maxCapture,&numPeriods);
    if (__pa_unsure_error_id_3 < 0) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        lVar5 = (long)__pa_unsure_error_id_3;
        pcVar6 = (*alsa_snd_strerror)(__pa_unsure_error_id_3);
        PaUtil_SetLastHostErrorInfo(paALSA,lVar5,pcVar6);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_get_period_size_min( hwParamsPlayback, &minPlayback, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2600\n"
                       );
      return -9999;
    }
    numPeriods = 0;
    maxBufferSize._4_4_ =
         (*(code *)alsa_snd_pcm_hw_params_get_period_size_max)
                   (hwParamsPlayback_local,&maxPlayback,&numPeriods);
    if (maxBufferSize._4_4_ < 0) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        lVar5 = (long)maxBufferSize._4_4_;
        pcVar6 = (*alsa_snd_strerror)(maxBufferSize._4_4_);
        PaUtil_SetLastHostErrorInfo(paALSA,lVar5,pcVar6);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_get_period_size_max( hwParamsCapture, &maxCapture, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2602\n"
                       );
      return -9999;
    }
    numPeriods = 0;
    maxBufferSize._0_4_ =
         (*(code *)alsa_snd_pcm_hw_params_get_period_size_max)
                   (psStack_40,&__pa_unsure_error_id_1,&numPeriods);
    if ((int)maxBufferSize < 0) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        lVar5 = (long)(int)maxBufferSize;
        pcVar6 = (*alsa_snd_strerror)((int)maxBufferSize);
        PaUtil_SetLastHostErrorInfo(paALSA,lVar5,pcVar6);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_get_period_size_max( hwParamsPlayback, &maxPlayback, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2604\n"
                       );
      return -9999;
    }
    if (minPlayback < maxCapture) {
      local_150 = maxCapture;
    }
    else {
      local_150 = minPlayback;
    }
    maxPeriodSize = local_150;
    if (___pa_unsure_error_id_1 < maxPlayback) {
      local_158 = ___pa_unsure_error_id_1;
    }
    else {
      local_158 = maxPlayback;
    }
    optimalPeriodSize = local_158;
    if (local_158 < local_150) {
      PaUtil_DebugPrint(
                       "Expression \'minPeriodSize <= maxPeriodSize\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2607\n"
                       );
      return -0x2709;
    }
    if (outputParameters_local->suggestedLatency <= *(double *)(framesPerUserBuffer_local + 0x10)) {
      local_160 = outputParameters_local->suggestedLatency;
    }
    else {
      local_160 = *(double *)(framesPerUserBuffer_local + 0x10);
    }
    uVar7 = (ulong)(local_160 * (double)inputParameters_local);
    e = uVar7 | (long)(local_160 * (double)inputParameters_local - 9.223372036854776e+18) &
                (long)uVar7 >> 0x3f;
    __pa_unsure_error_id_6 =
         (*(code *)alsa_snd_pcm_hw_params_get_buffer_size_max)
                   (hwParamsPlayback_local,&maxBufferSizePlayback);
    if (__pa_unsure_error_id_6 < 0) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        lVar5 = (long)__pa_unsure_error_id_6;
        pcVar6 = (*alsa_snd_strerror)(__pa_unsure_error_id_6);
        PaUtil_SetLastHostErrorInfo(paALSA,lVar5,pcVar6);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_get_buffer_size_max( hwParamsCapture, &maxBufferSizeCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2615\n"
                       );
      return -9999;
    }
    __pa_unsure_error_id_7 =
         (*(code *)alsa_snd_pcm_hw_params_get_buffer_size_max)(psStack_40,&__pa_unsure_error_id_5);
    if (__pa_unsure_error_id_7 < 0) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        lVar5 = (long)__pa_unsure_error_id_7;
        pcVar6 = (*alsa_snd_strerror)(__pa_unsure_error_id_7);
        PaUtil_SetLastHostErrorInfo(paALSA,lVar5,pcVar6);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_get_buffer_size_max( hwParamsPlayback, &maxBufferSizePlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2616\n"
                       );
      return -9999;
    }
    if (maxBufferSizePlayback < ___pa_unsure_error_id_5) {
      local_178 = maxBufferSizePlayback;
    }
    else {
      local_178 = ___pa_unsure_error_id_5;
    }
    maxBufferSizeCapture = local_178;
    if (e < local_178) {
      local_180 = e;
    }
    else {
      local_180 = local_178;
    }
    e = local_180;
    auVar9._8_4_ = (int)(maxPeriodSize >> 0x20);
    auVar9._0_8_ = maxPeriodSize;
    auVar9._12_4_ = 0x45300000;
    iVar2 = ilogb((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)maxPeriodSize) - 4503599627370496.0));
    minPeriodSize = (snd_pcm_uframes_t)iVar2;
    if ((maxPeriodSize & maxPeriodSize - 1) != 0) {
      minPeriodSize = minPeriodSize + 1;
    }
    auVar11._8_4_ = (int)(minPeriodSize >> 0x20);
    auVar11._0_8_ = minPeriodSize;
    auVar11._12_4_ = 0x45300000;
    dVar8 = pow(2.0,(auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)minPeriodSize) - 4503599627370496.0));
    minCapture = (long)dVar8 | (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f;
    while ((minCapture <= optimalPeriodSize &&
           ((iVar2 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                               (*(undefined8 *)((long)sampleRate_local + 0x340),psStack_40,
                                minCapture,0), iVar2 < 0 ||
            (iVar2 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                               (*(undefined8 *)((long)sampleRate_local + 0x2c0),
                                hwParamsPlayback_local,minCapture,0), iVar2 < 0))))) {
      minCapture = minCapture << 1;
    }
    if (maxPeriodSize < e / desiredBufSz._4_4_) {
      local_188 = e / desiredBufSz._4_4_;
    }
    else {
      local_188 = maxPeriodSize;
    }
    if (local_188 < optimalPeriodSize) {
      local_190 = local_188;
    }
    else {
      local_190 = optimalPeriodSize;
    }
    periodSize = local_190;
    auVar10._8_4_ = (int)(local_190 >> 0x20);
    auVar10._0_8_ = local_190;
    auVar10._12_4_ = 0x45300000;
    iVar2 = ilogb((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_190) - 4503599627370496.0));
    minPeriodSize = (snd_pcm_uframes_t)iVar2;
    if ((periodSize & periodSize - 1) != 0) {
      minPeriodSize = minPeriodSize + 1;
    }
    auVar12._8_4_ = (int)(minPeriodSize >> 0x20);
    auVar12._0_8_ = minPeriodSize;
    auVar12._12_4_ = 0x45300000;
    dVar8 = pow(2.0,(auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)minPeriodSize) - 4503599627370496.0));
    periodSize = (long)dVar8 | (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f;
    while ((minCapture <= periodSize &&
           ((iVar2 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                               (*(undefined8 *)((long)sampleRate_local + 0x2c0),
                                hwParamsPlayback_local,periodSize,0), iVar2 < 0 ||
            (iVar2 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                               (*(undefined8 *)((long)sampleRate_local + 0x340),psStack_40,
                                periodSize,0), iVar2 < 0))))) {
      periodSize = periodSize >> 1;
    }
    if (minCapture < periodSize) {
      minCapture = periodSize;
    }
    if (optimalPeriodSize < minCapture) {
      if (maxPeriodSize < e / desiredBufSz._4_4_) {
        local_1a8 = e / desiredBufSz._4_4_;
      }
      else {
        local_1a8 = maxPeriodSize;
      }
      if (local_1a8 < optimalPeriodSize) {
        local_1b0 = local_1a8;
      }
      else {
        local_1b0 = optimalPeriodSize;
      }
      periodSize = local_1b0;
      *(ulong *)((long)sampleRate_local + 0x2c8) = local_1b0;
      numPeriods = 0;
      maxPeriods = (*alsa_snd_pcm_hw_params_set_period_size_near)
                             (*(snd_pcm_t **)((long)sampleRate_local + 0x2c0),hwParamsPlayback_local
                              ,(snd_pcm_uframes_t *)((long)sampleRate_local + 0x2c8),
                              (int *)&numPeriods);
      if ((int)maxPeriods < 0) {
        pVar4 = pthread_self();
        iVar2 = pthread_equal(pVar4,paUnixMainThread);
        if (iVar2 != 0) {
          lVar5 = (long)(int)maxPeriods;
          pcVar6 = (*alsa_snd_strerror)(maxPeriods);
          PaUtil_SetLastHostErrorInfo(paALSA,lVar5,pcVar6);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( self->capture.pcm, hwParamsCapture, &self->capture.framesPerPeriod, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2682\n"
                         );
        return -9999;
      }
      *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x348) = periodSize;
      numPeriods = 0;
      local_f0 = (*alsa_snd_pcm_hw_params_set_period_size_near)
                           (*(snd_pcm_t **)((long)sampleRate_local + 0x340),psStack_40,
                            (snd_pcm_uframes_t *)((long)sampleRate_local + 0x348),(int *)&numPeriods
                           );
      if (local_f0 < 0) {
        pVar4 = pthread_self();
        iVar2 = pthread_equal(pVar4,paUnixMainThread);
        if (iVar2 != 0) {
          lVar5 = (long)local_f0;
          pcVar6 = (*alsa_snd_strerror)(local_f0);
          PaUtil_SetLastHostErrorInfo(paALSA,lVar5,pcVar6);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( self->playback.pcm, hwParamsPlayback, &self->playback.framesPerPeriod, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2686\n"
                         );
        return -9999;
      }
      if (*(ulong *)((long)sampleRate_local + 0x348) < *(ulong *)((long)sampleRate_local + 0x2c8)) {
        local_1c8 = *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x2c8);
      }
      else {
        local_1c8 = *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x348);
      }
      _accurate = local_1c8;
      *hostBufferSizeMode = paUtilBoundedHostBufferSize;
    }
    else {
      __pa_unsure_error_id_8 =
           (*(code *)alsa_snd_pcm_hw_params_set_period_size)
                     (*(undefined8 *)((long)sampleRate_local + 0x2c0),hwParamsPlayback_local,
                      minCapture,0);
      if (__pa_unsure_error_id_8 < 0) {
        pVar4 = pthread_self();
        iVar2 = pthread_equal(pVar4,paUnixMainThread);
        if (iVar2 != 0) {
          lVar5 = (long)__pa_unsure_error_id_8;
          pcVar6 = (*alsa_snd_strerror)(__pa_unsure_error_id_8);
          PaUtil_SetLastHostErrorInfo(paALSA,lVar5,pcVar6);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_set_period_size( self->capture.pcm, hwParamsCapture, periodSize, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2667\n"
                         );
        return -9999;
      }
      __pa_unsure_error_id_9 =
           (*(code *)alsa_snd_pcm_hw_params_set_period_size)
                     (*(undefined8 *)((long)sampleRate_local + 0x340),psStack_40,minCapture,0);
      if (__pa_unsure_error_id_9 < 0) {
        pVar4 = pthread_self();
        iVar2 = pthread_equal(pVar4,paUnixMainThread);
        if (iVar2 != 0) {
          lVar5 = (long)__pa_unsure_error_id_9;
          pcVar6 = (*alsa_snd_strerror)(__pa_unsure_error_id_9);
          PaUtil_SetLastHostErrorInfo(paALSA,lVar5,pcVar6);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_set_period_size( self->playback.pcm, hwParamsPlayback, periodSize, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2669\n"
                         );
        return -9999;
      }
      *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x348) = minCapture;
      *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x2c8) = minCapture;
      _accurate = minCapture;
    }
  }
  else {
    first._4_4_ = 0;
    second = &self->capture;
    firstStreamParams = (PaStreamParameters *)&self->playback;
    numPeriods = 0;
    iVar2 = (*(code *)alsa_snd_pcm_hw_params_get_periods_max)
                      (hwParamsPlayback,(long)&first + 4,&numPeriods);
    if (iVar2 < 0) {
      pVar4 = pthread_self();
      iVar3 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar3 != 0) {
        pcVar6 = (*alsa_snd_strerror)(iVar2);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar2,pcVar6);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_get_periods_max( hwParamsPlayback, &maxPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2703\n"
                       );
      return -9999;
    }
    ___pa_unsure_error_id_11 = hwParamsPlayback;
    secondHwParams = hwParamsCapture;
    firstHwParams = (snd_pcm_hw_params_t *)inputParameters;
    if (first._4_4_ < desiredBufSz._4_4_) {
      second = (PaAlsaStreamComponent *)((long)sampleRate_local + 0x308);
      firstStreamParams = (PaStreamParameters *)((long)sampleRate_local + 0x288);
      firstHwParams = (snd_pcm_hw_params_t *)framesPerUserBuffer_local;
      secondHwParams = psStack_40;
      ___pa_unsure_error_id_11 = hwParamsPlayback_local;
    }
    paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                           (second,(PaStreamParameters *)firstHwParams,
                            (unsigned_long)hwParamsCapture_local,(double)inputParameters_local,
                            secondHwParams,&local_58);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( first, firstStreamParams, framesPerUserBuffer, sampleRate, firstHwParams, &accurate )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2715\n"
                       );
      return paUtilErr_;
    }
    uVar1 = *(undefined4 *)((long)&second->framesPerPeriod + 4);
    firstStreamParams[2].device = *(undefined4 *)&second->framesPerPeriod;
    firstStreamParams[2].channelCount = uVar1;
    numPeriods = 0;
    iVar2 = (*alsa_snd_pcm_hw_params_set_period_size_near)
                      ((snd_pcm_t *)firstStreamParams[1].hostApiSpecificStreamInfo,
                       ___pa_unsure_error_id_11,(snd_pcm_uframes_t *)(firstStreamParams + 2),
                       (int *)&numPeriods);
    if (iVar2 < 0) {
      pVar4 = pthread_self();
      iVar3 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar3 != 0) {
        pcVar6 = (*alsa_snd_strerror)(iVar2);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar2,pcVar6);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( second->pcm, secondHwParams, &second->framesPerPeriod, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2720\n"
                       );
      return -9999;
    }
    if (*(long *)((long)sampleRate_local + 0x2c8) == *(long *)((long)sampleRate_local + 0x348)) {
      _accurate = *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x2c8);
    }
    else {
      if (*(ulong *)((long)sampleRate_local + 0x348) < *(ulong *)((long)sampleRate_local + 0x2c8)) {
        local_1e0 = *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x2c8);
      }
      else {
        local_1e0 = *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x348);
      }
      _accurate = local_1e0;
      *hostBufferSizeMode = paUtilBoundedHostBufferSize;
    }
  }
  if (_accurate == 0) {
    PaUtil_DebugPrint(
                     "Expression \'framesPerHostBuffer != 0\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2749\n"
                     );
    framesPerHostBuffer._4_4_ = -0x2702;
  }
  else {
    *(snd_pcm_uframes_t *)((long)sampleRate_local + 0x218) = _accurate;
    if (((*(int *)((long)sampleRate_local + 800) == 0) || (local_58 == 0)) &&
       (*hostBufferSizeMode = paUtilBoundedHostBufferSize, local_58 == 0)) {
      *(long *)((long)sampleRate_local + 0x218) = *(long *)((long)sampleRate_local + 0x218) + 1;
    }
  }
  return framesPerHostBuffer._4_4_;
}

Assistant:

static PaError PaAlsaStream_DetermineFramesPerBuffer( PaAlsaStream* self, double sampleRate, const PaStreamParameters* inputParameters,
        const PaStreamParameters* outputParameters, unsigned long framesPerUserBuffer, snd_pcm_hw_params_t* hwParamsCapture,
        snd_pcm_hw_params_t* hwParamsPlayback, PaUtilHostBufferSizeMode* hostBufferSizeMode )
{
    PaError result = paNoError;
    unsigned long framesPerHostBuffer = 0;
    int dir = 0;
    int accurate = 1;
    unsigned numPeriods = numPeriods_;

    if( self->capture.pcm && self->playback.pcm )
    {
        if( framesPerUserBuffer == paFramesPerBufferUnspecified )
        {
            /* Come up with a common desired latency */
            snd_pcm_uframes_t desiredBufSz, e, minPeriodSize, maxPeriodSize, optimalPeriodSize, periodSize,
                              minCapture, minPlayback, maxCapture, maxPlayback;

            dir = 0;
            ENSURE_( alsa_snd_pcm_hw_params_get_period_size_min( hwParamsCapture, &minCapture, &dir ), paUnanticipatedHostError );
            dir = 0;
            ENSURE_( alsa_snd_pcm_hw_params_get_period_size_min( hwParamsPlayback, &minPlayback, &dir ), paUnanticipatedHostError );
            dir = 0;
            ENSURE_( alsa_snd_pcm_hw_params_get_period_size_max( hwParamsCapture, &maxCapture, &dir ), paUnanticipatedHostError );
            dir = 0;
            ENSURE_( alsa_snd_pcm_hw_params_get_period_size_max( hwParamsPlayback, &maxPlayback, &dir ), paUnanticipatedHostError );
            minPeriodSize = PA_MAX( minPlayback, minCapture );
            maxPeriodSize = PA_MIN( maxPlayback, maxCapture );
            PA_UNLESS( minPeriodSize <= maxPeriodSize, paBadIODeviceCombination );

            desiredBufSz = (snd_pcm_uframes_t)( PA_MIN( outputParameters->suggestedLatency, inputParameters->suggestedLatency )
                    * sampleRate );
            /* Clamp desiredBufSz */
            {
                snd_pcm_uframes_t maxBufferSize;
                snd_pcm_uframes_t maxBufferSizeCapture, maxBufferSizePlayback;
                ENSURE_( alsa_snd_pcm_hw_params_get_buffer_size_max( hwParamsCapture, &maxBufferSizeCapture ), paUnanticipatedHostError );
                ENSURE_( alsa_snd_pcm_hw_params_get_buffer_size_max( hwParamsPlayback, &maxBufferSizePlayback ), paUnanticipatedHostError );
                maxBufferSize = PA_MIN( maxBufferSizeCapture, maxBufferSizePlayback );

                desiredBufSz = PA_MIN( desiredBufSz, maxBufferSize );
            }

            /* Find the closest power of 2 */
            e = ilogb( minPeriodSize );
            if( minPeriodSize & ( minPeriodSize - 1 ) )
                e += 1;
            periodSize = (snd_pcm_uframes_t)pow( 2, e );

            while( periodSize <= maxPeriodSize )
            {
                if( alsa_snd_pcm_hw_params_test_period_size( self->playback.pcm, hwParamsPlayback, periodSize, 0 ) >= 0 &&
                        alsa_snd_pcm_hw_params_test_period_size( self->capture.pcm, hwParamsCapture, periodSize, 0 ) >= 0 )
                {
                    /* OK! */
                    break;
                }

                periodSize *= 2;
            }

            optimalPeriodSize = PA_MAX( desiredBufSz / numPeriods, minPeriodSize );
            optimalPeriodSize = PA_MIN( optimalPeriodSize, maxPeriodSize );

            /* Find the closest power of 2 */
            e = ilogb( optimalPeriodSize );
            if( optimalPeriodSize & (optimalPeriodSize - 1) )
                e += 1;
            optimalPeriodSize = (snd_pcm_uframes_t)pow( 2, e );

            while( optimalPeriodSize >= periodSize )
            {
                if( alsa_snd_pcm_hw_params_test_period_size( self->capture.pcm, hwParamsCapture, optimalPeriodSize, 0 )
                        >= 0 && alsa_snd_pcm_hw_params_test_period_size( self->playback.pcm, hwParamsPlayback,
                            optimalPeriodSize, 0 ) >= 0 )
                {
                    break;
                }
                optimalPeriodSize /= 2;
            }

            if( optimalPeriodSize > periodSize )
                periodSize = optimalPeriodSize;

            if( periodSize <= maxPeriodSize )
            {
                /* Looks good, the periodSize _should_ be acceptable by both devices */
                ENSURE_( alsa_snd_pcm_hw_params_set_period_size( self->capture.pcm, hwParamsCapture, periodSize, 0 ),
                        paUnanticipatedHostError );
                ENSURE_( alsa_snd_pcm_hw_params_set_period_size( self->playback.pcm, hwParamsPlayback, periodSize, 0 ),
                        paUnanticipatedHostError );
                self->capture.framesPerPeriod = self->playback.framesPerPeriod = periodSize;
                framesPerHostBuffer = periodSize;
            }
            else
            {
                /* Unable to find a common period size, oh well */
                optimalPeriodSize = PA_MAX( desiredBufSz / numPeriods, minPeriodSize );
                optimalPeriodSize = PA_MIN( optimalPeriodSize, maxPeriodSize );

                self->capture.framesPerPeriod = optimalPeriodSize;
                dir = 0;
                ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( self->capture.pcm, hwParamsCapture, &self->capture.framesPerPeriod, &dir ),
                        paUnanticipatedHostError );
                self->playback.framesPerPeriod = optimalPeriodSize;
                dir = 0;
                ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( self->playback.pcm, hwParamsPlayback, &self->playback.framesPerPeriod, &dir ),
                        paUnanticipatedHostError );
                framesPerHostBuffer = PA_MAX( self->capture.framesPerPeriod, self->playback.framesPerPeriod );
                *hostBufferSizeMode = paUtilBoundedHostBufferSize;
            }
        }
        else
        {
            /* We choose the simple route and determine a suitable number of frames per buffer for one component of
             * the stream, then we hope that this will work for the other component too (it should!).
             */

            unsigned maxPeriods = 0;
            PaAlsaStreamComponent* first = &self->capture, * second = &self->playback;
            const PaStreamParameters* firstStreamParams = inputParameters;
            snd_pcm_hw_params_t* firstHwParams = hwParamsCapture, * secondHwParams = hwParamsPlayback;

            dir = 0;
            ENSURE_( alsa_snd_pcm_hw_params_get_periods_max( hwParamsPlayback, &maxPeriods, &dir ), paUnanticipatedHostError );
            if( maxPeriods < numPeriods )
            {
                /* The playback component is trickier to get right, try that first */
                first = &self->playback;
                second = &self->capture;
                firstStreamParams = outputParameters;
                firstHwParams = hwParamsPlayback;
                secondHwParams = hwParamsCapture;
            }

            PA_ENSURE( PaAlsaStreamComponent_DetermineFramesPerBuffer( first, firstStreamParams, framesPerUserBuffer,
                        sampleRate, firstHwParams, &accurate ) );

            second->framesPerPeriod = first->framesPerPeriod;
            dir = 0;
            ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( second->pcm, secondHwParams, &second->framesPerPeriod, &dir ),
                    paUnanticipatedHostError );
            if( self->capture.framesPerPeriod == self->playback.framesPerPeriod )
            {
                framesPerHostBuffer = self->capture.framesPerPeriod;
            }
            else
            {
                framesPerHostBuffer = PA_MAX( self->capture.framesPerPeriod, self->playback.framesPerPeriod );
                *hostBufferSizeMode = paUtilBoundedHostBufferSize;
            }
        }
    }
    else    /* half-duplex is a slightly simpler case */
    {
        if( self->capture.pcm )
        {
            PA_ENSURE( PaAlsaStreamComponent_DetermineFramesPerBuffer( &self->capture, inputParameters, framesPerUserBuffer,
                        sampleRate, hwParamsCapture, &accurate) );
            framesPerHostBuffer = self->capture.framesPerPeriod;
        }
        else
        {
            assert( self->playback.pcm );
            PA_ENSURE( PaAlsaStreamComponent_DetermineFramesPerBuffer( &self->playback, outputParameters, framesPerUserBuffer,
                        sampleRate, hwParamsPlayback, &accurate ) );
            framesPerHostBuffer = self->playback.framesPerPeriod;
        }
    }

    PA_UNLESS( framesPerHostBuffer != 0, paInternalError );
    self->maxFramesPerHostBuffer = framesPerHostBuffer;

    if( !self->playback.canMmap || !accurate )
    {
        /* Don't know the exact size per host buffer */
        *hostBufferSizeMode = paUtilBoundedHostBufferSize;
        /* Raise upper bound */
        if( !accurate )
            ++self->maxFramesPerHostBuffer;
    }

error:
    return result;
}